

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayFreeArrayBufferHelper.cpp
# Opt level: O1

void __thiscall
Js::DelayedFreeArrayBuffer::ScanStack
          (DelayedFreeArrayBuffer *this,void **stackTop,size_t byteCount,void **registers,
          size_t registersByteCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if ((DelayedFreeArrayBuffer *)
      (this->listOfBuffers).
      super_SListBase<Js::ArrayBufferContentForDelayedFreeBase_*,_Memory::HeapAllocator,_RealCount>.
      super_SListNodeBase<Memory::HeapAllocator>.next == this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x48,"(HasAnyItem())","HasAnyItem()");
    if (!bVar2) goto LAB_00b2d3cc;
    *puVar3 = 0;
  }
  ResetToNoMarkObject(this);
  if (registersByteCount == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x4d,"(byteCount != 0)","byteCount != 0");
    if (!bVar2) goto LAB_00b2d3cc;
    *puVar3 = 0;
  }
  if ((registersByteCount & 7) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x4e,"(byteCount % sizeof(void *) == 0)",
                                "byteCount % sizeof(void *) == 0");
    if (!bVar2) goto LAB_00b2d3cc;
    *puVar3 = 0;
  }
  uVar4 = 0;
  do {
    CheckAndMarkObject(this,*(void **)((long)registers + uVar4));
    uVar4 = uVar4 + 8;
  } while ((registersByteCount & 0xfffffffffffffff8) != uVar4);
  if (byteCount == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x4d,"(byteCount != 0)","byteCount != 0");
    if (!bVar2) goto LAB_00b2d3cc;
    *puVar3 = 0;
  }
  if ((byteCount & 7) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DelayFreeArrayBufferHelper.cpp"
                                ,0x4e,"(byteCount % sizeof(void *) == 0)",
                                "byteCount % sizeof(void *) == 0");
    if (!bVar2) {
LAB_00b2d3cc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  uVar4 = 0;
  do {
    CheckAndMarkObject(this,*(void **)((long)stackTop + uVar4));
    uVar4 = uVar4 + 8;
  } while ((byteCount & 0xfffffffffffffff8) != uVar4);
  ReleaseOnlyNonMarkedObject(this);
  return;
}

Assistant:

void DelayedFreeArrayBuffer::ScanStack(void ** stackTop, size_t byteCount, void ** registers, size_t registersByteCount)
    {
        AssertOrFailFast(HasAnyItem());
        ResetToNoMarkObject();

        auto BufferFreeFunction = [&](void ** obj, size_t byteCount)
        {
            Assert(byteCount != 0);
            Assert(byteCount % sizeof(void *) == 0);

            void ** objEnd = obj + (byteCount / sizeof(void *));

            do
            {
                // We need to ensure that the compiler does not reintroduce reads to the object after inlining.
                // This could cause the value to change after the marking checks (e.g., the null/low address check).
                // Intrinsics avoid the expensive memory barrier on ARM (due to /volatile:ms).
#if defined(_M_ARM64)
                void * candidate = reinterpret_cast<void *>(__iso_volatile_load64(reinterpret_cast<volatile __int64 *>(obj)));
#elif defined(_M_ARM)
                void * candidate = reinterpret_cast<void *>(__iso_volatile_load32(reinterpret_cast<volatile __int32 *>(obj)));
#else
                void * candidate = *(static_cast<void * volatile *>(obj));
#endif
                CheckAndMarkObject(candidate);
                obj++;
            } while (obj != objEnd);

        };

        BufferFreeFunction(registers, registersByteCount);
        BufferFreeFunction(stackTop, byteCount);

        ReleaseOnlyNonMarkedObject();
    }